

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaAllocator_T::DestroyPool(VmaAllocator_T *this,VmaPool pool)

{
  bool bVar1;
  int iVar2;
  pthread_rwlock_t *__rwlock;
  
  bVar1 = this->m_UseMutex;
  __rwlock = (pthread_rwlock_t *)0x0;
  if (bVar1 != false) {
    __rwlock = (pthread_rwlock_t *)&this->m_PoolsMutex;
  }
  if (bVar1 == true) {
    iVar2 = pthread_rwlock_wrlock(__rwlock);
    if (iVar2 == 0x23) {
      std::__throw_system_error(0x23);
    }
  }
  VmaIntrusiveLinkedList<VmaPoolListItemTraits>::Remove(&this->m_Pools,pool);
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  vma_delete<VmaPool_T>(this,pool);
  return;
}

Assistant:

void VmaAllocator_T::DestroyPool(VmaPool pool)
{
    // Remove from m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        m_Pools.Remove(pool);
    }

    vma_delete(this, pool);
}